

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

int4 __thiscall PcodeOp::compareOrder(PcodeOp *this,PcodeOp *bop)

{
  uintm uVar1;
  uintm uVar2;
  BlockBasic *pBVar3;
  FlowBlock *common;
  PcodeOp *bop_local;
  PcodeOp *this_local;
  
  if (this->parent == bop->parent) {
    uVar1 = SeqNum::getOrder(&this->start);
    uVar2 = SeqNum::getOrder(&bop->start);
    this_local._4_4_ = 1;
    if (uVar1 < uVar2) {
      this_local._4_4_ = -1;
    }
  }
  else {
    pBVar3 = (BlockBasic *)
             FlowBlock::findCommonBlock
                       (&this->parent->super_FlowBlock,&bop->parent->super_FlowBlock);
    if (pBVar3 == this->parent) {
      this_local._4_4_ = -1;
    }
    else if (pBVar3 == bop->parent) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int4 PcodeOp::compareOrder(const PcodeOp *bop) const

{
  if (parent == bop->parent)
    return (start.getOrder() < bop->start.getOrder()) ? -1 : 1;

  FlowBlock *common = FlowBlock::findCommonBlock(parent,bop->parent);
  if (common == parent)
    return -1;
  if (common == bop->parent)
    return 1;
  return 0;
}